

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_completed_queue.cpp
# Opt level: O1

void __thiscall libtorrent::aux::disk_completed_queue::call_job_handlers(disk_completed_queue *this)

{
  disk_job *pdVar1;
  disk_job *this_00;
  unique_lock<std::mutex> l;
  static_vector<libtorrent::aux::disk_job_*,_64UL,_void> to_delete;
  int local_254;
  disk_job **local_250;
  unique_lock<std::mutex> local_248;
  disk_job *local_238 [64];
  ulong local_38;
  
  counters::inc_stats_counter(this->m_stats_counters,0x41,1);
  local_248._M_owns = false;
  local_248._M_device = &this->m_completed_jobs_mutex;
  ::std::unique_lock<std::mutex>::lock(&local_248);
  local_248._M_owns = true;
  this->m_job_completions_in_flight = false;
  this_00 = (this->m_completed_jobs).m_first;
  (this->m_completed_jobs).m_first = (disk_job *)0x0;
  (this->m_completed_jobs).m_last = (disk_job *)0x0;
  (this->m_completed_jobs).m_size = 0;
  ::std::unique_lock<std::mutex>::unlock(&local_248);
  local_38 = 0;
  if (this_00 != (disk_job *)0x0) {
    do {
      pdVar1 = (this_00->super_tailqueue_node<libtorrent::aux::disk_job>).next;
      disk_job::call_callback(this_00);
      if (0x3f < local_38) {
        boost::container::dtl::
        static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>::on_capacity_overflow
                  ();
      }
      local_238[local_38] = this_00;
      local_38 = local_38 + 1;
      if (local_38 == 0x40) {
        local_250 = local_238;
        local_254 = 0x40;
        if ((this->m_free_jobs).super__Function_base._M_manager == (_Manager_type)0x0) {
          ::std::__throw_bad_function_call();
        }
        (*(this->m_free_jobs)._M_invoker)((_Any_data *)&this->m_free_jobs,&local_250,&local_254);
        local_38 = 0;
      }
      this_00 = pdVar1;
    } while (pdVar1 != (disk_job *)0x0);
  }
  if (local_38 != 0) {
    local_250 = local_238;
    local_254 = (int)local_38;
    if ((this->m_free_jobs).super__Function_base._M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->m_free_jobs)._M_invoker)((_Any_data *)&this->m_free_jobs,&local_250,&local_254);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_248);
  return;
}

Assistant:

void disk_completed_queue::call_job_handlers()
{
	m_stats_counters.inc_stats_counter(counters::on_disk_counter);
	std::unique_lock<std::mutex> l(m_completed_jobs_mutex);

	DLOG("call_job_handlers (%d)\n", m_completed_jobs.size());

	TORRENT_ASSERT(m_job_completions_in_flight);
	m_job_completions_in_flight = false;

	auto* j = static_cast<aux::disk_job*>(m_completed_jobs.get_all());
	l.unlock();

	boost::container::static_vector<aux::disk_job*, 64> to_delete;

	while (j)
	{
		TORRENT_ASSERT(j->job_posted == true);
		TORRENT_ASSERT(j->callback_called == false);
		DLOG("   callback: %s\n", print_job(*j).c_str());
		auto* next = static_cast<aux::disk_job*>(j->next);

#if TORRENT_USE_ASSERTS
		j->callback_called = true;
#endif
		j->call_callback();
		to_delete.push_back(j);
		j = next;
		if (to_delete.size() == to_delete.capacity())
		{
			m_free_jobs(to_delete.data(), int(to_delete.size()));
			to_delete.clear();
		}
	}

	if (!to_delete.empty()) m_free_jobs(to_delete.data(), int(to_delete.size()));
}